

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::
 write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,decimal_fp<float> *fp,basic_format_specs<char> *specs,float_specs fspecs,
           char decimal_point)

{
  size_type sVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bVar6;
  size_t sVar7;
  ulong uVar8;
  pointer pcVar9;
  size_t __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  char cVar10;
  ulong uVar11;
  pointer __s;
  int iVar12;
  long lVar13;
  pointer pcVar14;
  sign_t sVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  int num_zeros;
  sign_t sign;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_28_7_94dcc806 write;
  undefined1 local_85 [5];
  sign_t local_80;
  int local_7c;
  uint local_78;
  undefined1 local_74 [4];
  decimal_fp<float> local_70;
  anon_class_56_7_a2a26a24 local_68;
  
  uVar17 = fp->significand;
  uVar16 = 0x1f;
  if ((uVar17 | 1) != 0) {
    for (; (uVar17 | 1) >> uVar16 == 0; uVar16 = uVar16 - 1) {
    }
  }
  lVar19 = (ulong)*(ushort *)(bsr2log10(int)::data + (ulong)uVar16 * 2) -
           (ulong)(uVar17 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                                     (ulong)*(ushort *)(bsr2log10(int)::data + (ulong)uVar16 * 2) *
                                     4));
  iVar18 = (int)lVar19;
  uVar3 = fspecs._4_4_;
  sVar15 = uVar3 >> 8 & 0xff;
  uVar8 = (ulong)((iVar18 + 1) - (uint)(sVar15 == none));
  uVar16 = fp->exponent;
  local_74 = (undefined1  [4])(uVar16 + iVar18);
  iVar4 = fspecs.precision;
  local_85[0] = decimal_point;
  local_80 = sVar15;
  local_7c = iVar18;
  local_78 = uVar17;
  local_70 = (decimal_fp<float>)fspecs;
  if (fspecs._4_1_ == '\x01') {
LAB_001128dc:
    iVar12 = uVar16 + iVar18 + -1;
    if ((uVar3 >> 0x14 & 1) == 0) {
      uVar5 = 0;
      uVar11 = (ulong)(byte)decimal_point;
      if (iVar18 == 1) {
        uVar11 = uVar5;
      }
      cVar10 = (char)uVar11;
    }
    else {
      uVar5 = 0;
      if (0 < iVar4 - iVar18) {
        uVar5 = (ulong)(uint)(iVar4 - iVar18);
      }
      uVar8 = uVar8 + uVar5;
      cVar10 = decimal_point;
    }
    iVar4 = 1 - (int)local_74;
    if (0 < (int)local_74) {
      iVar4 = iVar12;
    }
    lVar13 = 2;
    if (99 < iVar4) {
      lVar13 = (ulong)(999 < iVar4) + 3;
    }
    sVar7 = (3 - (ulong)(cVar10 == '\0')) + uVar8 + lVar13;
    local_68.sign = (sign_t *)(CONCAT44(uVar17,uVar3 >> 8) & 0xffffffff000000ff);
    local_68.significand._0_5_ = CONCAT14(cVar10,iVar18);
    local_68.significand_size =
         (int *)(CONCAT35(local_68.significand_size._5_3_,
                          CONCAT14(((uVar3 >> 0x10 & 1) == 0) << 5,(int)uVar5)) | 0x4500000000);
    local_68.fp = (decimal_fp<float> *)CONCAT44(local_68.fp._4_4_,iVar12);
    if (0 < specs->width) {
      bVar6 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_1_&>
                        (out,specs,sVar7,sVar7,(anon_class_28_7_94dcc806 *)&local_68);
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )bVar6.container;
    }
    sVar1 = (out.container)->_M_string_length;
    std::__cxx11::string::resize((ulong)out.container,(char)sVar7 + (char)sVar1);
    pcVar14 = ((out.container)->_M_dataplus)._M_p + sVar1;
    if (sVar15 != none) {
      *pcVar14 = *(char *)((long)&basic_data<void>::signs + (ulong)sVar15);
      pcVar14 = pcVar14 + 1;
    }
    if (cVar10 == '\0') {
      __s = pcVar14 + lVar19;
      pcVar14 = __s;
      uVar16 = uVar17;
      if (99 < uVar17) {
        do {
          uVar16 = uVar17 / 100;
          *(undefined2 *)(pcVar14 + -2) =
               *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar17 % 100) * 2);
          pcVar14 = pcVar14 + -2;
          bVar2 = 9999 < uVar17;
          uVar17 = uVar17 / 100;
        } while (bVar2);
      }
      if (uVar16 < 10) {
        pcVar14[-1] = (byte)uVar16 | 0x30;
      }
      else {
        *(undefined2 *)(pcVar14 + -2) =
             *(undefined2 *)(basic_data<void>::digits + (ulong)uVar16 * 2);
      }
    }
    else {
      __s = pcVar14 + (long)iVar18 + 1;
      pcVar9 = __s;
      uVar16 = uVar17;
      if (99 < uVar17) {
        do {
          uVar17 = uVar16 / 100;
          *(undefined2 *)(pcVar9 + -2) =
               *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar16 % 100) * 2);
          pcVar9 = pcVar9 + -2;
          bVar2 = 9999 < uVar16;
          uVar16 = uVar16 / 100;
        } while (bVar2);
      }
      if (uVar17 < 10) {
        pcVar9[-1] = (byte)uVar17 | 0x30;
      }
      else {
        *(undefined2 *)(pcVar9 + -2) = *(undefined2 *)(basic_data<void>::digits + (ulong)uVar17 * 2)
        ;
      }
      *pcVar14 = pcVar14[1];
      pcVar14[1] = cVar10;
    }
    __n = (size_t)(int)local_68.significand_size;
    pcVar14 = __s;
    if (0 < (long)__n) {
      pcVar14 = __s + __n;
      memset(__s,0x30,__n);
    }
    *pcVar14 = local_68.significand_size._4_1_;
    write_exponent<char,char*>((int)local_68.fp,pcVar14 + 1);
    return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )out.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    iVar12 = 0x10;
    if (0 < iVar4) {
      iVar12 = iVar4;
    }
    if (((int)local_74 < -3) || (iVar12 < (int)local_74)) goto LAB_001128dc;
  }
  if ((int)uVar16 < 0) {
    if (0 < (int)local_74) {
      local_85._1_4_ = iVar4 - iVar18 & (int)(uVar3 << 0xb) >> 0x1f;
      local_68.decimal_point = local_85 + 1;
      uVar5 = (ulong)(uint)local_85._1_4_;
      if ((int)local_85._1_4_ < 1) {
        uVar5 = 0;
      }
      sVar7 = uVar5 + 1 + uVar8;
      local_68.sign = &local_80;
      local_68.significand = &local_78;
      local_68.significand_size = &local_7c;
      local_68.fp = (decimal_fp<float> *)local_74;
      local_68.fspecs = (float_specs *)local_85;
      bVar6 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_3_&>
                        (out,specs,sVar7,sVar7,(anon_class_48_6_48d028d1 *)&local_68);
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )bVar6.container;
    }
    iVar12 = -(int)local_74;
    local_85._1_4_ = iVar12;
    if (SBORROW4(iVar4,iVar12) != iVar4 + (int)local_74 < 0) {
      local_85._1_4_ = iVar4;
    }
    if (iVar4 < 0) {
      local_85._1_4_ = iVar12;
    }
    if (iVar18 != 0) {
      local_85._1_4_ = iVar12;
    }
    local_68.significand = (significand_type *)(local_85 + 1);
    sVar7 = (local_85._1_4_ + 2) + uVar8;
    local_68.sign = &local_80;
    local_68.significand_size = &local_7c;
    local_68.fp = &local_70;
    local_68.fspecs = (float_specs *)local_85;
    local_68.decimal_point = (char *)&local_78;
    bVar6 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_4_&>
                      (out,specs,sVar7,sVar7,(anon_class_48_6_9afe1116 *)&local_68);
    return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )bVar6.container;
  }
  sVar7 = uVar8 + uVar16;
  local_85._1_4_ = iVar4 - (int)local_74;
  if ((uVar3 >> 0x14 & 1) != 0) {
    if ((fspecs._4_1_ == '\x02') || (0 < (int)local_85._1_4_)) {
      if ((int)local_85._1_4_ < 1) goto LAB_00112a92;
    }
    else {
      local_85._1_4_ = 1;
    }
    sVar7 = sVar7 + (uint)local_85._1_4_;
  }
LAB_00112a92:
  local_68.sign = &local_80;
  local_68.significand = &local_78;
  local_68.significand_size = &local_7c;
  local_68.fspecs = (float_specs *)&local_70;
  local_68.decimal_point = local_85;
  local_68.num_zeros = (int *)(local_85 + 1);
  local_68.fp = fp;
  bVar6 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_2_&>
                    (out,specs,sVar7,sVar7,&local_68);
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )bVar6.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}